

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_dict.c
# Opt level: O0

REF_STATUS ref_dict_store(REF_DICT ref_dict,REF_INT key,REF_INT value)

{
  int iVar1;
  int iVar2;
  REF_INT *pRVar3;
  int local_28;
  int local_24;
  REF_INT insert_point;
  REF_INT i;
  REF_INT value_local;
  REF_INT key_local;
  REF_DICT ref_dict_local;
  
  if (ref_dict->max == ref_dict->n) {
    ref_dict->max = ref_dict->max + 1000;
    fflush(_stdout);
    if (0 < ref_dict->max) {
      pRVar3 = (REF_INT *)realloc(ref_dict->key,(long)ref_dict->max << 2);
      ref_dict->key = pRVar3;
    }
    if (ref_dict->key == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dict.c",0x52,
             "ref_dict_store","realloc ref_dict->key NULL");
      printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",(ulong)(uint)ref_dict->max,
             (long)ref_dict->max,4,(long)ref_dict->max << 2);
      return 2;
    }
    fflush(_stdout);
    if (0 < ref_dict->max) {
      pRVar3 = (REF_INT *)realloc(ref_dict->value,(long)ref_dict->max << 2);
      ref_dict->value = pRVar3;
    }
    if (ref_dict->value == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dict.c",0x53,
             "ref_dict_store","realloc ref_dict->value NULL");
      printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",(ulong)(uint)ref_dict->max,
             (long)ref_dict->max,4,(long)ref_dict->max << 2);
      return 2;
    }
  }
  local_28 = 0;
  iVar1 = ref_dict->n;
  do {
    local_24 = iVar1 + -1;
    iVar2 = local_28;
    if (local_24 < 0) break;
    if (ref_dict->key[local_24] == key) {
      ref_dict->value[local_24] = value;
      return 0;
    }
    iVar2 = iVar1;
    iVar1 = local_24;
  } while (key <= ref_dict->key[local_24]);
  local_28 = iVar2;
  for (local_24 = ref_dict->n; local_28 < local_24; local_24 = local_24 + -1) {
    ref_dict->key[local_24] = ref_dict->key[local_24 + -1];
  }
  for (local_24 = ref_dict->n; local_28 < local_24; local_24 = local_24 + -1) {
    ref_dict->value[local_24] = ref_dict->value[local_24 + -1];
  }
  ref_dict->n = ref_dict->n + 1;
  ref_dict->key[local_28] = key;
  ref_dict->value[local_28] = value;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_dict_store(REF_DICT ref_dict, REF_INT key,
                                  REF_INT value) {
  REF_INT i, insert_point;

  if (ref_dict_max(ref_dict) == ref_dict_n(ref_dict)) {
    ref_dict_max(ref_dict) += 1000;

    ref_realloc(ref_dict->key, ref_dict_max(ref_dict), REF_INT);
    ref_realloc(ref_dict->value, ref_dict_max(ref_dict), REF_INT);
  }

  insert_point = 0;
  for (i = ref_dict_n(ref_dict) - 1; i >= 0; i--) {
    if (ref_dict->key[i] == key) {
      ref_dict->value[i] = value;
      return REF_SUCCESS;
    }
    if (ref_dict->key[i] < key) {
      insert_point = i + 1;
      break;
    }
  }
  /* shift to open up insert_point */
  for (i = ref_dict_n(ref_dict); i > insert_point; i--)
    ref_dict->key[i] = ref_dict->key[i - 1];
  for (i = ref_dict_n(ref_dict); i > insert_point; i--)
    ref_dict->value[i] = ref_dict->value[i - 1];

  /* fill insert_point */
  ref_dict_n(ref_dict)++;
  ref_dict->key[insert_point] = key;
  ref_dict->value[insert_point] = value;

  return REF_SUCCESS;
}